

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_user(connectdata *conn)

{
  void *pvVar1;
  char *local_38;
  FTP *ftp;
  CURLcode result;
  connectdata *conn_local;
  
  pvVar1 = (conn->data->req).protop;
  if (*(long *)((long)pvVar1 + 8) == 0) {
    local_38 = "";
  }
  else {
    local_38 = *(char **)((long)pvVar1 + 8);
  }
  conn_local._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"USER %s",local_38);
  if (conn_local._4_4_ == CURLE_OK) {
    _state(conn,FTP_USER);
    (conn->data->state).ftp_trying_alternative = false;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_user(struct connectdata *conn)
{
  CURLcode result;
  struct FTP *ftp = conn->data->req.protop;
  /* send USER */
  PPSENDF(&conn->proto.ftpc.pp, "USER %s", ftp->user?ftp->user:"");

  state(conn, FTP_USER);
  conn->data->state.ftp_trying_alternative = FALSE;

  return CURLE_OK;
}